

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeConvolution(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  uint32 uVar5;
  string *psVar6;
  string *psVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  reference __x;
  ConvolutionParameter *from;
  BlobProto *pBVar9;
  BlobShape *pBVar10;
  ValidPadding *pVVar11;
  BorderAmounts *pBVar12;
  WeightParams *pWVar13;
  RepeatedField<float> *pRVar14;
  NetParameter *in_stack_00000008;
  float local_87c;
  RepeatedField<float> *local_878;
  RepeatedField<float> *bias;
  string local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  float local_7ac;
  RepeatedField<float> *local_7a8;
  RepeatedField<float> *weights;
  string local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  int local_6dc;
  int iStack_6d8;
  int caffeBlobSizeWeights;
  uint64_t blobSize;
  uint32_t widthDilation;
  uint32_t heightDilation;
  RepeatedField<unsigned_long> *local_6c0;
  RepeatedField<unsigned_long> *dilation;
  BorderAmounts_EdgeSizes *widthBorder;
  BorderAmounts_EdgeSizes *heightBorder;
  uint32 local_6a0;
  uint32_t pad_w;
  uint32_t pad_h;
  uint32 local_678;
  uint local_674;
  uint32_t Kw;
  uint32_t Kh;
  RepeatedField<unsigned_long> *local_668;
  RepeatedField<unsigned_long> *kernelSize;
  uint32_t widthStride;
  uint32_t heightStride;
  RepeatedField<unsigned_long> *local_650;
  RepeatedField<unsigned_long> *stride;
  allocator local_621;
  string local_620;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  string local_5b8;
  allocator local_591;
  string local_590;
  string local_570;
  allocator local_549;
  string local_548;
  string local_528;
  allocator local_501;
  string local_500;
  allocator local_4d9;
  string local_4d8;
  string local_4b8;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  uint local_218;
  byte local_212;
  allocator local_211;
  int caffeBiasLength;
  bool hasBias;
  allocator local_1e9;
  string local_1e8;
  uint32 local_1c8;
  allocator local_1c1;
  uint32_t numberGroups;
  uint64 local_1a0;
  int64_t kernelChannels;
  int64_t outputChannelsWeight;
  ConvolutionLayerParams *pCStack_188;
  uint32_t outputChannels;
  ConvolutionLayerParams *specLayerParams;
  ConvolutionParameter caffeLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_61;
  string local_60;
  NeuralNetworkLayer *local_40;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_40 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar3 = caffe::LayerParameter::bottom_size(pLStack_18);
  if ((iVar3 != 1) || (iVar3 = caffe::LayerParameter::top_size(pLStack_18), iVar3 != 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Must have 1 input and 1 output",&local_61);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_60,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar8);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar8);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1,(iterator *)&bottomName), bVar2) {
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar8 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar8);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar8);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1_1,(iterator *)&topName), bVar2) {
    caffeLayerParams._144_8_ =
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)caffeLayerParams._144_8_);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  convertCaffeMetadata
            (psVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  from = caffe::LayerParameter::convolution_param(pLStack_18);
  caffe::ConvolutionParameter::ConvolutionParameter((ConvolutionParameter *)&specLayerParams,from);
  pCStack_188 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(local_40);
  outputChannelsWeight._4_4_ =
       caffe::ConvolutionParameter::num_output((ConvolutionParameter *)&specLayerParams);
  kernelChannels = 0;
  local_1a0 = 0;
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&numberGroups,"Weight blobs not provided",&local_1c1);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto((string *)&numberGroups,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&numberGroups);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  local_1c8 = caffe::ConvolutionParameter::group((ConvolutionParameter *)&specLayerParams);
  if (local_1c8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"group parameter cannot be 0",&local_1e9);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_1e8,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if ((iVar3 == 2) ||
     (iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames), iVar3 == 1)
     ) {
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar10 = caffe::BlobProto::shape(pBVar9);
    iVar3 = caffe::BlobShape::dim_size(pBVar10);
    if (iVar3 == 0) {
      pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      iVar4 = caffe::BlobProto::num(pBVar9);
      kernelChannels = (int64_t)iVar4;
      pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      iVar4 = caffe::BlobProto::channels(pBVar9);
      local_1a0 = (uint64)iVar4;
    }
    else {
      psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      bVar2 = std::operator==(psVar6,"Deconvolution");
      if (bVar2) {
        pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar10 = caffe::BlobProto::shape(pBVar9);
        kernelChannels = caffe::BlobShape::dim(pBVar10,1);
        pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar10 = caffe::BlobProto::shape(pBVar9);
        local_1a0 = caffe::BlobShape::dim(pBVar10,0);
      }
      else {
        pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar10 = caffe::BlobProto::shape(pBVar9);
        kernelChannels = caffe::BlobShape::dim(pBVar10,0);
        pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar10 = caffe::BlobProto::shape(pBVar9);
        local_1a0 = caffe::BlobShape::dim(pBVar10,1);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&caffeBiasLength,"Number of blobs must be 2 or 1 (when there is no bias)",
               &local_211);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto((string *)&caffeBiasLength,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&caffeBiasLength);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  local_212 = caffe::ConvolutionParameter::bias_term((ConvolutionParameter *)&specLayerParams);
  local_218 = 0;
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (1 < iVar3) {
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
    local_218 = caffe::BlobProto::data_size(pBVar9);
  }
  psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
  bVar2 = std::operator==(psVar6,"Deconvolution");
  if (bVar2) {
    if ((ulong)outputChannelsWeight._4_4_ != kernelChannels * (ulong)local_1c8) {
      std::__cxx11::to_string(&local_2f8,outputChannelsWeight._4_4_);
      std::operator+(&local_2d8,"\'num_output\' (",&local_2f8);
      std::operator+(&local_2b8,&local_2d8,") divided by groups (");
      std::__cxx11::to_string(&local_318,local_1c8);
      std::operator+(&local_298,&local_2b8,&local_318);
      std::operator+(&local_278,&local_298,"does not match the first dimension of weights (");
      std::__cxx11::to_string(&local_338,kernelChannels);
      std::operator+(&local_258,&local_278,&local_338);
      std::operator+(&local_238,&local_258,")");
      psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_238,psVar6,psVar7);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
  }
  else {
    if ((ulong)outputChannelsWeight._4_4_ != kernelChannels) {
      std::__cxx11::to_string(&local_3d8,outputChannelsWeight._4_4_);
      std::operator+(&local_3b8,"\'num_output\' (",&local_3d8);
      std::operator+(&local_398,&local_3b8,") does not match the first dimension of weights (");
      std::__cxx11::to_string(&local_3f8,kernelChannels);
      std::operator+(&local_378,&local_398,&local_3f8);
      std::operator+(&local_358,&local_378,")");
      psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_358,psVar6,psVar7);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    if (outputChannelsWeight._4_4_ % local_1c8 != 0) {
      std::__cxx11::to_string(&local_498,outputChannelsWeight._4_4_);
      std::operator+(&local_478,"\'num_output\' (",&local_498);
      std::operator+(&local_458,&local_478,") must be divisible by \'groups\' (");
      std::__cxx11::to_string(&local_4b8,local_1c8);
      std::operator+(&local_438,&local_458,&local_4b8);
      std::operator+(&local_418,&local_438,")");
      psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_418,psVar6,psVar7);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
    }
  }
  if ((((local_212 & 1) != 0) && (local_218 == 0)) ||
     (((local_212 & 1) == 0 && (0 < (int)local_218)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4d8,"\'bias_term\' flag and blob size for bias incompatible",
               &local_4d9);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_4d8,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  iVar4 = caffe::ConvolutionParameter::axis((ConvolutionParameter *)&specLayerParams);
  if (iVar4 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_500,"axis",&local_501);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar4 = caffe::ConvolutionParameter::axis((ConvolutionParameter *)&specLayerParams);
    std::__cxx11::to_string(&local_528,iVar4);
    unsupportedCaffeParrameterWithOption(&local_500,psVar6,psVar7,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
  }
  iVar3 = caffe::ConvolutionParameter::kernel_size_size((ConvolutionParameter *)&specLayerParams);
  if (2 < iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"Number of kernel size values",&local_549);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar3 = caffe::ConvolutionParameter::kernel_size_size((ConvolutionParameter *)&specLayerParams);
    std::__cxx11::to_string(&local_570,iVar3);
    unsupportedCaffeParrameterWithOption(&local_548,psVar6,psVar7,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
  }
  iVar3 = caffe::ConvolutionParameter::pad_size((ConvolutionParameter *)&specLayerParams);
  if (2 < iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_590,"Number of pad values",&local_591);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar3 = caffe::ConvolutionParameter::pad_size((ConvolutionParameter *)&specLayerParams);
    std::__cxx11::to_string(&local_5b8,iVar3);
    unsupportedCaffeParrameterWithOption(&local_590,psVar6,psVar7,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
  }
  iVar3 = caffe::ConvolutionParameter::stride_size((ConvolutionParameter *)&specLayerParams);
  if (2 < iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d8,"Number of stride values",&local_5d9);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar3 = caffe::ConvolutionParameter::stride_size((ConvolutionParameter *)&specLayerParams);
    std::__cxx11::to_string(&local_600,iVar3);
    unsupportedCaffeParrameterWithOption(&local_5d8,psVar6,psVar7,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  }
  iVar3 = caffe::ConvolutionParameter::dilation_size((ConvolutionParameter *)&specLayerParams);
  if (2 < iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_620,"Number of dilation size values",&local_621);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar3 = caffe::ConvolutionParameter::dilation_size((ConvolutionParameter *)&specLayerParams);
    std::__cxx11::to_string((string *)&stride,iVar3);
    unsupportedCaffeParrameterWithOption(&local_620,psVar6,psVar7,(string *)&stride);
    std::__cxx11::string::~string((string *)&stride);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
  }
  psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
  bVar2 = std::operator==(psVar6,"Deconvolution");
  if (bVar2) {
    CoreML::Specification::ConvolutionLayerParams::set_isdeconvolution(pCStack_188,true);
  }
  else {
    CoreML::Specification::ConvolutionLayerParams::set_isdeconvolution(pCStack_188,false);
  }
  CoreML::Specification::ConvolutionLayerParams::set_hasbias(pCStack_188,(bool)(local_212 & 1));
  CoreML::Specification::ConvolutionLayerParams::set_ngroups(pCStack_188,(ulong)local_1c8);
  local_650 = CoreML::Specification::ConvolutionLayerParams::mutable_stride(pCStack_188);
  _widthStride = 0;
  google::protobuf::RepeatedField<unsigned_long>::Resize(local_650,2,(unsigned_long *)&widthStride);
  kernelSize._0_4_ = 1;
  kernelSize._4_4_ = 1;
  iVar3 = caffe::ConvolutionParameter::stride_size((ConvolutionParameter *)&specLayerParams);
  if (iVar3 == 0) {
    uVar5 = caffe::ConvolutionParameter::stride_h((ConvolutionParameter *)&specLayerParams);
    if ((uVar5 != 0) &&
       (uVar5 = caffe::ConvolutionParameter::stride_w((ConvolutionParameter *)&specLayerParams),
       uVar5 != 0)) {
      kernelSize._4_4_ =
           caffe::ConvolutionParameter::stride_h((ConvolutionParameter *)&specLayerParams);
      kernelSize._0_4_ =
           caffe::ConvolutionParameter::stride_w((ConvolutionParameter *)&specLayerParams);
    }
  }
  else {
    kernelSize._4_4_ =
         caffe::ConvolutionParameter::stride((ConvolutionParameter *)&specLayerParams,0);
    iVar3 = caffe::ConvolutionParameter::stride_size((ConvolutionParameter *)&specLayerParams);
    if (iVar3 == 1) {
      kernelSize._0_4_ = kernelSize._4_4_;
    }
    else {
      kernelSize._0_4_ =
           caffe::ConvolutionParameter::stride((ConvolutionParameter *)&specLayerParams,1);
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_stride(pCStack_188,0,(ulong)kernelSize._4_4_);
  CoreML::Specification::ConvolutionLayerParams::set_stride(pCStack_188,1,(ulong)(uint32)kernelSize)
  ;
  local_668 = CoreML::Specification::ConvolutionLayerParams::mutable_kernelsize(pCStack_188);
  _Kw = 0;
  google::protobuf::RepeatedField<unsigned_long>::Resize(local_668,2,(unsigned_long *)&Kw);
  local_678 = 3;
  local_674 = 3;
  iVar3 = caffe::ConvolutionParameter::kernel_size_size((ConvolutionParameter *)&specLayerParams);
  if (iVar3 == 0) {
    uVar5 = caffe::ConvolutionParameter::kernel_h((ConvolutionParameter *)&specLayerParams);
    if ((uVar5 == 0) ||
       (uVar5 = caffe::ConvolutionParameter::kernel_w((ConvolutionParameter *)&specLayerParams),
       uVar5 == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&pad_h,"Kernel size cannot be 0",(allocator *)((long)&pad_w + 3));
      psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto((string *)&pad_h,psVar6,psVar7);
      std::__cxx11::string::~string((string *)&pad_h);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pad_w + 3));
    }
    else {
      local_674 = caffe::ConvolutionParameter::kernel_h((ConvolutionParameter *)&specLayerParams);
      local_678 = caffe::ConvolutionParameter::kernel_w((ConvolutionParameter *)&specLayerParams);
    }
  }
  else {
    local_674 = caffe::ConvolutionParameter::kernel_size((ConvolutionParameter *)&specLayerParams,0)
    ;
    iVar3 = caffe::ConvolutionParameter::kernel_size_size((ConvolutionParameter *)&specLayerParams);
    if (iVar3 == 1) {
      local_678 = local_674;
    }
    else {
      local_678 = caffe::ConvolutionParameter::kernel_size
                            ((ConvolutionParameter *)&specLayerParams,1);
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_kernelsize(pCStack_188,0,(ulong)local_674);
  CoreML::Specification::ConvolutionLayerParams::set_kernelsize(pCStack_188,1,(ulong)local_678);
  local_6a0 = 0;
  heightBorder._4_4_ = 0;
  iVar3 = caffe::ConvolutionParameter::pad_size((ConvolutionParameter *)&specLayerParams);
  if (iVar3 == 0) {
    local_6a0 = caffe::ConvolutionParameter::pad_h((ConvolutionParameter *)&specLayerParams);
    heightBorder._4_4_ =
         caffe::ConvolutionParameter::pad_w((ConvolutionParameter *)&specLayerParams);
  }
  else {
    local_6a0 = caffe::ConvolutionParameter::pad((ConvolutionParameter *)&specLayerParams,0);
    iVar3 = caffe::ConvolutionParameter::pad_size((ConvolutionParameter *)&specLayerParams);
    if (iVar3 == 1) {
      heightBorder._4_4_ = local_6a0;
    }
    else {
      heightBorder._4_4_ =
           caffe::ConvolutionParameter::pad((ConvolutionParameter *)&specLayerParams,1);
    }
  }
  if ((heightBorder._4_4_ == 0) && (local_6a0 == 0)) {
    CoreML::Specification::ConvolutionLayerParams::mutable_valid(pCStack_188);
  }
  else {
    pVVar11 = CoreML::Specification::ConvolutionLayerParams::mutable_valid(pCStack_188);
    pBVar12 = CoreML::Specification::ValidPadding::mutable_paddingamounts(pVVar11);
    widthBorder = CoreML::Specification::BorderAmounts::add_borderamounts(pBVar12);
    CoreML::Specification::BorderAmounts_EdgeSizes::set_startedgesize(widthBorder,(ulong)local_6a0);
    CoreML::Specification::BorderAmounts_EdgeSizes::set_endedgesize(widthBorder,(ulong)local_6a0);
    pVVar11 = CoreML::Specification::ConvolutionLayerParams::mutable_valid(pCStack_188);
    pBVar12 = CoreML::Specification::ValidPadding::mutable_paddingamounts(pVVar11);
    dilation = (RepeatedField<unsigned_long> *)
               CoreML::Specification::BorderAmounts::add_borderamounts(pBVar12);
    CoreML::Specification::BorderAmounts_EdgeSizes::set_startedgesize
              ((BorderAmounts_EdgeSizes *)dilation,(ulong)heightBorder._4_4_);
    CoreML::Specification::BorderAmounts_EdgeSizes::set_endedgesize
              ((BorderAmounts_EdgeSizes *)dilation,(ulong)heightBorder._4_4_);
  }
  local_6c0 = CoreML::Specification::ConvolutionLayerParams::mutable_dilationfactor(pCStack_188);
  _widthDilation = 0;
  google::protobuf::RepeatedField<unsigned_long>::Resize
            (local_6c0,2,(unsigned_long *)&widthDilation);
  blobSize._0_4_ = 1;
  blobSize._4_4_ = 1;
  iVar3 = caffe::ConvolutionParameter::dilation_size((ConvolutionParameter *)&specLayerParams);
  if (iVar3 != 0) {
    blobSize._4_4_ =
         caffe::ConvolutionParameter::dilation((ConvolutionParameter *)&specLayerParams,0);
    iVar3 = caffe::ConvolutionParameter::dilation_size((ConvolutionParameter *)&specLayerParams);
    if (iVar3 == 1) {
      blobSize._0_4_ = blobSize._4_4_;
    }
    else {
      blobSize._0_4_ =
           caffe::ConvolutionParameter::dilation((ConvolutionParameter *)&specLayerParams,1);
    }
  }
  CoreML::Specification::ConvolutionLayerParams::set_dilationfactor
            (pCStack_188,0,(ulong)blobSize._4_4_);
  CoreML::Specification::ConvolutionLayerParams::set_dilationfactor
            (pCStack_188,1,(ulong)(uint32)blobSize);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels
            (pCStack_188,(ulong)outputChannelsWeight._4_4_);
  if ((long)local_1a0 < 0) {
    __assert_fail("kernelChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xe5,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels(pCStack_188,local_1a0);
  _iStack_6d8 = kernelChannels * local_1a0 * (ulong)local_674 * (ulong)local_678;
  pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  local_6dc = caffe::BlobProto::data_size(pBVar9);
  if (local_6dc < 0) {
    __assert_fail("caffeBlobSizeWeights >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xeb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  if ((long)local_6dc != _iStack_6d8) {
    std::__cxx11::to_string(&local_780,_iStack_6d8);
    std::operator+(&local_760,"Expected blob size = ",&local_780);
    std::operator+(&local_740,&local_760," but found blob of size = ");
    std::__cxx11::to_string((string *)&weights,local_6dc);
    std::operator+(&local_720,&local_740,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&weights);
    std::operator+(&local_700,&local_720," in caffe");
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_700,psVar6,psVar7);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&weights);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_780);
  }
  pWVar13 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(pCStack_188);
  local_7a8 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar13);
  if (_iStack_6d8 < 0x80000000) {
    local_7ac = 0.0;
    google::protobuf::RepeatedField<float>::Resize(local_7a8,iStack_6d8,&local_7ac);
    pRVar1 = local_7a8;
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pRVar14 = caffe::BlobProto::data(pBVar9);
    google::protobuf::RepeatedField<float>::CopyFrom(pRVar1,pRVar14);
    if ((local_212 & 1) != 0) {
      if (local_218 != outputChannelsWeight._4_4_) {
        std::__cxx11::to_string(&local_850,outputChannelsWeight._4_4_);
        std::operator+(&local_830,"Expected blob size = ",&local_850);
        std::operator+(&local_810,&local_830," but found blob of size = ");
        std::__cxx11::to_string((string *)&bias,local_218);
        std::operator+(&local_7f0,&local_810,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bias);
        std::operator+(&local_7d0,&local_7f0," in caffe");
        psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
        psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
        errorInCaffeProto(&local_7d0,psVar6,psVar7);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&bias);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_850);
      }
      pWVar13 = CoreML::Specification::ConvolutionLayerParams::mutable_bias(pCStack_188);
      local_878 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar13);
      if (0x7fffffff < outputChannelsWeight._4_4_) {
        __assert_fail("outputChannels <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                      ,0xfb,
                      "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      local_87c = 0.0;
      google::protobuf::RepeatedField<float>::Resize
                (local_878,outputChannelsWeight._4_4_,&local_87c);
      pRVar1 = local_878;
      pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
      pRVar14 = caffe::BlobProto::data(pBVar9);
      google::protobuf::RepeatedField<float>::CopyFrom(pRVar1,pRVar14);
    }
    caffe::ConvolutionParameter::~ConvolutionParameter((ConvolutionParameter *)&specLayerParams);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("blobSize <= INT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                ,0xf0,
                "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    caffe::ConvolutionParameter caffeLayerParams = caffeLayer.convolution_param();
    Specification::ConvolutionLayerParams* specLayerParams = specLayer->mutable_convolution();

    // weights shape for coreml and caffe:
    // convolution ==> [outputChannels, kernelChannels, kernelHeight, kernelWidth] == [outputChannelsWeight, kernelChannels, kernelHeight, kernelWidth]
    // deconvoltuion ==> [kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth] == [kernelChannels, outputChannelsWeight, kernelHeight, kernelWidth]
    uint32_t outputChannels = caffeLayerParams.num_output();
    int64_t outputChannelsWeight = 0;
    int64_t kernelChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), caffeLayer.type());
    }
    
    //check that groups are not 0
    uint32_t numberGroups = caffeLayerParams.group();
    if (numberGroups==0) {
        CoreMLConverter::errorInCaffeProto("group parameter cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    
    if (caffeLayerWeights.blobs_size() == 2 || caffeLayerWeights.blobs_size() == 1){
        
        // Sometimes caffe models do not populate the shape (infering from other parameters)
        if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
            outputChannelsWeight = caffeLayerWeights.blobs(0).num();
            kernelChannels = caffeLayerWeights.blobs(0).channels();
        } else {
            if (caffeLayer.type() == "Deconvolution") {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(1);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(0);
            } else {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(0);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(1);
            }
        }
    } else {
        CoreMLConverter::errorInCaffeProto("Number of blobs must be 2 or 1 (when there is no bias)", caffeLayer.name(), caffeLayer.type());
    }
    
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayer.type() == "Deconvolution") {
        if (outputChannels!= outputChannelsWeight * numberGroups){
            CoreMLConverter::errorInCaffeProto(
                                               "'num_output' ("+std::to_string(outputChannels)+") divided by groups (" + std::to_string(numberGroups) + "does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    } else {
        if (outputChannels!= outputChannelsWeight){
            CoreMLConverter::errorInCaffeProto(
                    "'num_output' ("+std::to_string(outputChannels)+") does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                            ,caffeLayer.name(), caffeLayer.type());
        }
        if (outputChannels % numberGroups != 0){
            CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(outputChannels)+") must be divisible by 'groups' (" + std::to_string(numberGroups) + ")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.kernel_size_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of kernel size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.kernel_size_size()));
    }
    if (caffeLayerParams.pad_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of pad values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.pad_size()));
    }
    if (caffeLayerParams.stride_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of stride values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.stride_size()));
    }
    
    if (caffeLayerParams.dilation_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of dilation size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.dilation_size()));
    }
    //**************************************************************
    
    if (caffeLayer.type() == "Deconvolution"){
        specLayerParams->set_isdeconvolution(true);
    } else {
        specLayerParams->set_isdeconvolution(false);
    }
    specLayerParams->set_hasbias(hasBias);
    assert(numberGroups >= 0);
    specLayerParams->set_ngroups(static_cast<uint64_t>(numberGroups));
    
    //Set Stride
    ::google::protobuf::RepeatedField<uint64_t>* stride = specLayerParams->mutable_stride();
    stride->Resize(2, 0);
    uint32_t heightStride, widthStride;
    heightStride = widthStride = 1;
    if (caffeLayerParams.stride_size() != 0) {
        heightStride = caffeLayerParams.stride(0);
        if (caffeLayerParams.stride_size() == 1){
            widthStride = heightStride;
        } else {
            widthStride = caffeLayerParams.stride(1);
        }
    } else if (caffeLayerParams.stride_h() != 0 && caffeLayerParams.stride_w() != 0) {
        heightStride = caffeLayerParams.stride_h();
        widthStride = caffeLayerParams.stride_w();
    }
    specLayerParams->set_stride(0, static_cast<uint64_t>(heightStride));
    specLayerParams->set_stride(1, static_cast<uint64_t>(widthStride));
    
    //Set Kernel sizes
    ::google::protobuf::RepeatedField<uint64_t>* kernelSize = specLayerParams->mutable_kernelsize();
    kernelSize->Resize(2, 0);
    uint32_t Kh, Kw;
    Kh = Kw = 3;
    if (caffeLayerParams.kernel_size_size() != 0) {
        Kh = caffeLayerParams.kernel_size(0);
        if (caffeLayerParams.kernel_size_size() == 1){
            Kw = Kh;
        } else {
            Kw = caffeLayerParams.kernel_size(1);
        }
    } else if (caffeLayerParams.kernel_h() != 0 && caffeLayerParams.kernel_w() != 0) {
        Kh = caffeLayerParams.kernel_h();
        Kw = caffeLayerParams.kernel_w();
    } else {
        CoreMLConverter::errorInCaffeProto("Kernel size cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    specLayerParams->set_kernelsize(0, static_cast<uint64_t>(Kh));
    specLayerParams->set_kernelsize(1, static_cast<uint64_t>(Kw));
    
    //Set padding params
    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.pad_size() != 0) {
        pad_h = caffeLayerParams.pad(0);
        if (caffeLayerParams.pad_size()==1){
            pad_w = pad_h;
        } else {
            pad_w = caffeLayerParams.pad(1);
        }
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    if (pad_w==0 && pad_h==0){
        (void) specLayerParams->mutable_valid();
    } else {
        auto heightBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        heightBorder->set_startedgesize(static_cast<uint64_t>(pad_h));
        heightBorder->set_endedgesize(static_cast<uint64_t>(pad_h));
        auto widthBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        widthBorder->set_startedgesize(static_cast<uint64_t>(pad_w));
        widthBorder->set_endedgesize(static_cast<uint64_t>(pad_w));
    }
    
    //Set dilation params
    ::google::protobuf::RepeatedField<uint64_t>* dilation = specLayerParams->mutable_dilationfactor();
    dilation->Resize(2, 0);
    uint32_t heightDilation, widthDilation;
    heightDilation = widthDilation = 1;
    if (caffeLayerParams.dilation_size() != 0) {
        heightDilation = caffeLayerParams.dilation(0);
        if (caffeLayerParams.dilation_size() == 1){
            widthDilation = heightDilation;
        } else {
            widthDilation = caffeLayerParams.dilation(1);
        }
    }
    specLayerParams->set_dilationfactor(0, static_cast<uint64_t>(heightDilation));
    specLayerParams->set_dilationfactor(1, static_cast<uint64_t>(widthDilation));
    
    // Write weights
    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    assert(kernelChannels >= 0);
    specLayerParams->set_kernelchannels(static_cast<uint64_t>(kernelChannels));
    
    uint64_t blobSize = static_cast<uint64_t>(outputChannelsWeight) * static_cast<uint64_t>(kernelChannels) * static_cast<uint64_t>(Kh) * static_cast<uint64_t>(Kw);
    
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    assert(caffeBlobSizeWeights >= 0);
    if (static_cast<uint64_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string     (caffeBlobSizeWeights)+" in caffe", caffeLayer.name(), caffeLayer.type());
    }
    ::google::protobuf::RepeatedField<float>* weights = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weights->Resize(static_cast<int32_t>(blobSize), 0.0);
    weights->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength != static_cast<int32_t>(outputChannels)) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                              , caffeLayer.name(), caffeLayer.type());
        }
        ::google::protobuf::RepeatedField<float>* bias = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        bias->Resize(static_cast<int32_t>(outputChannels), 0.0);
        bias->CopyFrom(caffeLayerWeights.blobs(1).data());
    }
}